

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O0

int Fxu_Select(Fxu_Matrix *p,Fxu_Single **ppSingle,Fxu_Double **ppDouble)

{
  Fxu_Pair *pFVar1;
  Fxu_Double *pFVar2;
  int fBestS;
  int iNum;
  int WeightCur;
  int WeightBest;
  int i;
  int nDoubles;
  int nSingles;
  Fxu_Pair *pPair;
  Fxu_Double *pDComplD [20];
  Fxu_Single *pDComplS [20];
  Fxu_Double *pSCompl [20];
  Fxu_Double *pDoubles [20];
  Fxu_Single *pSingles [20];
  Fxu_Double **ppDouble_local;
  Fxu_Single **ppSingle_local;
  Fxu_Matrix *p_local;
  
  memset(pDoubles + 0x13,0,0xa0);
  memset(pSCompl + 0x13,0,0xa0);
  memset(pDComplS + 0x13,0,0xa0);
  memset(pDComplD + 0x13,0,0xa0);
  memset(&pPair,0,0xa0);
  for (i = 0; i < 0x14; i = i + 1) {
    pFVar2 = (Fxu_Double *)Fxu_HeapSingleGetMax(p->pHeapSingle);
    pDoubles[(long)i + 0x13] = pFVar2;
    if (pDoubles[(long)i + 0x13] == (Fxu_Double *)0x0) break;
  }
  for (WeightCur = 0; WeightCur < i; WeightCur = WeightCur + 1) {
    if (pDoubles[(long)WeightCur + 0x13] != (Fxu_Double *)0x0) {
      Fxu_HeapSingleInsert(p->pHeapSingle,(Fxu_Single *)pDoubles[(long)WeightCur + 0x13]);
    }
  }
  for (WeightBest = 0; WeightBest < 0x14; WeightBest = WeightBest + 1) {
    pFVar2 = Fxu_HeapDoubleGetMax(p->pHeapDouble);
    pSCompl[(long)WeightBest + 0x13] = pFVar2;
    if (pSCompl[(long)WeightBest + 0x13] == (Fxu_Double *)0x0) break;
  }
  for (WeightCur = 0; WeightCur < WeightBest; WeightCur = WeightCur + 1) {
    if (pSCompl[(long)WeightCur + 0x13] != (Fxu_Double *)0x0) {
      Fxu_HeapDoubleInsert(p->pHeapDouble,pSCompl[(long)WeightCur + 0x13]);
    }
  }
  for (WeightCur = 0; WeightCur < i; WeightCur = WeightCur + 1) {
    if (pDoubles[(long)WeightCur + 0x13] != (Fxu_Double *)0x0) {
      pFVar2 = Fxu_MatrixFindComplementSingle(p,(Fxu_Single *)pDoubles[(long)WeightCur + 0x13]);
      pDComplS[(long)WeightCur + 0x13] = (Fxu_Single *)pFVar2;
    }
  }
  for (WeightCur = 0; WeightCur < WeightBest; WeightCur = WeightCur + 1) {
    if (pSCompl[(long)WeightCur + 0x13] != (Fxu_Double *)0x0) {
      pFVar1 = (pSCompl[(long)WeightCur + 0x13]->lPairs).pHead;
      if ((pFVar1->nLits1 == 1) && (pFVar1->nLits2 == 1)) {
        pFVar2 = (Fxu_Double *)Fxu_MatrixFindComplementDouble2(p,pSCompl[(long)WeightCur + 0x13]);
        pDComplD[(long)WeightCur + 0x13] = pFVar2;
        pDComplD[(long)WeightCur + -1] = (Fxu_Double *)0x0;
      }
      else {
        pDComplD[(long)WeightCur + 0x13] = (Fxu_Double *)0x0;
        pDComplD[(long)WeightCur + -1] = (Fxu_Double *)0x0;
      }
    }
  }
  iNum = -1;
  for (WeightCur = 0; WeightCur < i; WeightCur = WeightCur + 1) {
    fBestS = pDoubles[(long)WeightCur + 0x13]->Weight;
    if (pDComplS[(long)WeightCur + 0x13] != (Fxu_Single *)0x0) {
      fBestS = pDComplS[(long)WeightCur + 0x13]->pVar1->iVar +
               pDComplS[(long)WeightCur + 0x13]->pVar1->nCubes +
               pDComplS[(long)WeightCur + 0x13]->Weight + fBestS;
    }
    if (iNum < fBestS) {
      iNum = fBestS;
      *ppSingle = (Fxu_Single *)pDoubles[(long)WeightCur + 0x13];
      *ppDouble = (Fxu_Double *)pDComplS[(long)WeightCur + 0x13];
    }
  }
  for (WeightCur = 0; WeightCur < WeightBest; WeightCur = WeightCur + 1) {
    fBestS = pSCompl[(long)WeightCur + 0x13]->Weight;
    if (pDComplD[(long)WeightCur + 0x13] != (Fxu_Double *)0x0) {
      pFVar1 = (pSCompl[(long)WeightCur + 0x13]->lPairs).pHead;
      fBestS = pFVar1->nLits1 + pFVar1->nLits2 + pDComplD[(long)WeightCur + 0x13]->Weight + fBestS;
    }
    if (iNum < fBestS) {
      iNum = fBestS;
      *ppSingle = (Fxu_Single *)pDComplD[(long)WeightCur + 0x13];
      *ppDouble = pSCompl[(long)WeightCur + 0x13];
    }
  }
  return iNum;
}

Assistant:

int Fxu_Select( Fxu_Matrix * p, Fxu_Single ** ppSingle, Fxu_Double ** ppDouble )
{
    // the top entries
    Fxu_Single * pSingles[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDoubles[MAX_SIZE_LOOKAHEAD] = {0};
    // the complements
    Fxu_Double * pSCompl[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Single * pDComplS[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Double * pDComplD[MAX_SIZE_LOOKAHEAD] = {0};
    Fxu_Pair * pPair;
    int nSingles;
    int nDoubles;
    int i;
    int WeightBest;
    int WeightCur;
    int iNum, fBestS;

    // collect the top entries from the queues
    for ( nSingles = 0; nSingles < MAX_SIZE_LOOKAHEAD; nSingles++ )
    {
        pSingles[nSingles] = Fxu_HeapSingleGetMax( p->pHeapSingle );
        if ( pSingles[nSingles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            Fxu_HeapSingleInsert( p->pHeapSingle, pSingles[i] );
        
    // the same for doubles
    // collect the top entries from the queues
    for ( nDoubles = 0; nDoubles < MAX_SIZE_LOOKAHEAD; nDoubles++ )
    {
        pDoubles[nDoubles] = Fxu_HeapDoubleGetMax( p->pHeapDouble );
        if ( pDoubles[nDoubles] == NULL )
            break;
    }
    // put them back into the queue
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
            Fxu_HeapDoubleInsert( p->pHeapDouble, pDoubles[i] );

    // for each single, find the complement double (if any)
    for ( i = 0; i < nSingles; i++ )
        if ( pSingles[i] )
            pSCompl[i] = Fxu_MatrixFindComplementSingle( p, pSingles[i] );

    // for each double, find the complement single or double (if any)
    for ( i = 0; i < nDoubles; i++ )
        if ( pDoubles[i] )
        {
            pPair = pDoubles[i]->lPairs.pHead;
            if ( pPair->nLits1 == 1 && pPair->nLits2 == 1 )
            {
                pDComplS[i] = Fxu_MatrixFindComplementDouble2( p, pDoubles[i] );
                pDComplD[i] = NULL;
            }
//            else if ( pPair->nLits1 == 2 && pPair->nLits2 == 2 )
//            {
//                pDComplS[i] = NULL;
//                pDComplD[i] = Fxu_MatrixFindComplementDouble4( p, pDoubles[i] );
//            }
            else
            {
                pDComplS[i] = NULL;
                pDComplD[i] = NULL;
            }
        }

    // select the best pair
    WeightBest = -1;
    for ( i = 0; i < nSingles; i++ )
    {
        WeightCur = pSingles[i]->Weight;
        if ( pSCompl[i] )
        {
            // add the weight of the double
            WeightCur += pSCompl[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pSCompl[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pSingles[i];
            *ppDouble = pSCompl[i];
            fBestS = 1;
            iNum = i;
        }
    }
    for ( i = 0; i < nDoubles; i++ )
    {
        WeightCur = pDoubles[i]->Weight;
        if ( pDComplS[i] )
        {
            // add the weight of the single
            WeightCur += pDComplS[i]->Weight;
            // there is no need to implement this double, so...
            pPair      = pDoubles[i]->lPairs.pHead;
            WeightCur += pPair->nLits1 + pPair->nLits2;
        }
        if ( WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            *ppSingle = pDComplS[i];
            *ppDouble = pDoubles[i];
            fBestS = 0;
            iNum = i;
        }
    }
/*
    // print the statistics
    printf( "\n" );
    for ( i = 0; i < nSingles; i++ )
    {
        printf( "Single #%d: Weight = %3d. ", i, pSingles[i]->Weight );
        printf( "Compl: " );
        if ( pSCompl[i] == NULL )
            printf( "None." );
        else
            printf( "D  Weight = %3d  Sum = %3d", 
                pSCompl[i]->Weight, pSCompl[i]->Weight + pSingles[i]->Weight );
        printf( "\n" );
    }
    printf( "\n" );
    for ( i = 0; i < nDoubles; i++ )
    {
        printf( "Double #%d: Weight = %3d. ", i, pDoubles[i]->Weight );
        printf( "Compl: " );
        if ( pDComplS[i] == NULL && pDComplD[i] == NULL )
            printf( "None." );
        else if ( pDComplS[i] )
            printf( "S  Weight = %3d  Sum = %3d", 
                pDComplS[i]->Weight, pDComplS[i]->Weight + pDoubles[i]->Weight );
        else if ( pDComplD[i] )
            printf( "D  Weight = %3d  Sum = %3d", 
                pDComplD[i]->Weight, pDComplD[i]->Weight + pDoubles[i]->Weight );
        printf( "\n" );
    }
    if ( WeightBest == -1 )
        printf( "Selected NONE\n" );
    else
    {
        printf( "Selected = %s.  ", fBestS? "S": "D" );
        printf( "Number = %d.  ", iNum );
        printf( "Weight = %d.\n", WeightBest );
    }
    printf( "\n" );
*/
    return WeightBest;
}